

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptExpr.cpp
# Opt level: O2

void __thiscall
GlobOpt::CSEAddInstr
          (GlobOpt *this,BasicBlock *block,Instr *instr,Value *dstVal,Value *src1Val,Value *src2Val,
          Value *dstIndirIndexVal,Value *src1IndirIndexVal)

{
  GlobOptBlockData *this_00;
  OpCode OVar1;
  Opnd *pOVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  BailOutKind BVar6;
  undefined4 *puVar7;
  StackSym *pSVar8;
  Value **ppVVar9;
  RegOpnd *pRVar10;
  IndirOpnd *pIVar11;
  ulong uVar12;
  long lVar13;
  ValueInfo *this_01;
  GlobOpt *this_02;
  ExprAttributes EVar14;
  BasicBlock *pBVar15;
  int32 local_5c;
  BasicBlock *pBStack_58;
  int32 intConstantValue;
  Value *local_50;
  GlobOpt *local_48;
  Value *local_40;
  ExprHash local_38;
  undefined4 local_34;
  ExprHash hash;
  
  local_38 = (ExprHash)0x0;
  this_02 = this;
  pBStack_58 = block;
  local_50 = src2Val;
  local_40 = dstVal;
  bVar4 = DoCSE(this);
  if (!bVar4) {
    return;
  }
  OVar1 = instr->m_opcode;
  uVar12 = (ulong)(OVar1 - 0x1be);
  if (OVar1 - 0x1be < 0x23) {
    if ((0x41edUL >> (uVar12 & 0x3f) & 1) == 0) {
      if ((0x600000000U >> (uVar12 & 0x3f) & 1) == 0) {
        if (uVar12 != 4) goto LAB_00468549;
        if (((((instr->field_0x38 & 0x10) != 0) &&
             (BVar6 = IR::Instr::GetBailOutKind(instr), (BVar6 >> 0xb & 1) != 0)) &&
            (bVar4 = IR::Instr::ShouldCheckFor32BitOverflow(instr), !bVar4)) &&
           (instr->ignoreOverflowBitCount != '5')) {
          return;
        }
        goto LAB_004681c8;
      }
      bVar4 = IR::Opnd::IsUnsigned(instr->m_dst);
      bVar5 = IR::Opnd::IsUnsigned(instr->m_src1);
      EVar14.attributes = bVar4 + 2;
      if (!bVar5) {
        EVar14.attributes = (uint)bVar4;
      }
    }
    else {
LAB_004681c8:
      EVar14.attributes = *(uint *)&this->field_0xf4 >> 2 & 3;
    }
LAB_004681d7:
    local_34 = 0;
  }
  else {
LAB_00468549:
    if ((OVar1 - 0x25e < 7) && ((0x43U >> (OVar1 - 0x25e & 0x1f) & 1) != 0)) {
      bVar4 = IR::Instr::ShouldCheckForNegativeZero(instr);
      local_34 = 0;
      EVar14.attributes = 0;
      if (!bVar4) {
        return;
      }
    }
    else {
      lVar13 = 0x48;
      EVar14.attributes = 0;
      if (OVar1 != LdElemI_A) {
        if (OVar1 != StElemI_A) {
          if (OVar1 == LdArrViewElem) goto LAB_004685ca;
          if (OVar1 != StElemI_A_Strict) goto LAB_004681d7;
        }
        bVar4 = CanCSEArrayStore(this_02,instr);
        if (!bVar4) {
          return;
        }
        lVar13 = 0x40;
        src1IndirIndexVal = dstIndirIndexVal;
        local_40 = src1Val;
      }
LAB_004685ca:
      local_48 = this;
      pIVar11 = IR::Opnd::AsIndirOpnd(*(Opnd **)((long)&instr->_vptr_Instr + lVar13));
      this_00 = &pBStack_58->globOptData;
      src1Val = GlobOptBlockData::FindValue(this_00,&pIVar11->m_baseOpnd->m_sym->super_Sym);
      local_50 = src1IndirIndexVal;
      if (src1IndirIndexVal == (Value *)0x0) {
        if (pIVar11->m_indexOpnd == (RegOpnd *)0x0) {
          return;
        }
        local_50 = GlobOptBlockData::FindValue(this_00,&pIVar11->m_indexOpnd->m_sym->super_Sym);
      }
      bVar4 = ValueType::IsLikelyOptimizedVirtualTypedArray(&src1Val->valueInfo->super_ValueType);
      local_34 = (undefined4)CONCAT71((int7)((ulong)lVar13 >> 8),1);
      this = local_48;
      if (bVar4) {
        bVar4 = (*(ushort *)&instr->field_0x36 >> 0xe & 1) == 0;
        EVar14.attributes = bVar4 + 2;
        if ((short)*(ushort *)&instr->field_0x36 < 0) {
          EVar14.attributes = (uint)bVar4;
        }
      }
    }
  }
  if (instr->m_dst == (Opnd *)0x0) {
    this_01 = (ValueInfo *)0x0;
  }
  else {
    if (local_40 == (Value *)0x0) {
      return;
    }
    this_01 = local_40->valueInfo;
    if (this_01->symStore == (Sym *)0x0) {
      if ((char)local_34 == '\0') {
        return;
      }
      bVar4 = ValueInfo::HasIntConstantValue(this_01,false);
      if (!bVar4) {
        return;
      }
      bVar4 = ValueType::IsIntAndLikelyTagged(&this_01->super_ValueType);
      if (!bVar4) {
        return;
      }
      bVar4 = IR::Opnd::IsAddrOpnd(instr->m_src1);
      if (!bVar4) {
        return;
      }
    }
  }
  bVar4 = GetHash(this,instr,src1Val,local_50,EVar14,&local_38);
  pBVar15 = pBStack_58;
  if (bVar4) {
    if (((this_01 != (ValueInfo *)0x0) && (this_01->symStore == (Sym *)0x0)) &&
       (bVar4 = ValueInfo::TryGetIntConstantValue(this_01,&local_5c,false), bVar4)) {
      if ((char)local_34 == '\0') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x137,"(isArray)","isArray");
        if (!bVar4) goto LAB_00468663;
        *puVar7 = 0;
        pBVar15 = pBStack_58;
      }
      bVar4 = ValueType::IsIntAndLikelyTagged(&this_01->super_ValueType);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x138,"(valueInfo->IsIntAndLikelyTagged())",
                           "valueInfo->IsIntAndLikelyTagged()");
        if (!bVar4) goto LAB_00468663;
        *puVar7 = 0;
      }
      bVar4 = IR::Opnd::IsAddrOpnd(instr->m_src1);
      if (!bVar4) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptExpr.cpp"
                           ,0x139,"(instr->GetSrc1()->IsAddrOpnd())",
                           "instr->GetSrc1()->IsAddrOpnd()");
        if (!bVar4) {
LAB_00468663:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar7 = 0;
      }
      pSVar8 = GetOrCreateTaggedIntConstantStackSym(this,local_5c);
      IR::Instr::HoistSrc1(instr,Ld_A,RegNOREG,pSVar8);
      GlobOptBlockData::SetValue(&this->currentBlock->globOptData,local_40,&pSVar8->super_Sym);
    }
    ppVVar9 = ValueHashTable<ExprHash,_Value_*>::FindOrInsertNew
                        ((pBVar15->globOptData).exprToValueMap,local_38);
    *ppVVar9 = local_40;
    if ((char)local_34 != '\0') {
      BVSparse<Memory::JitArenaAllocator>::Set
                ((pBVar15->globOptData).liveArrayValues,(BVIndex)local_38);
    }
    bVar4 = MayNeedBailOnImplicitCall(instr,src1Val,local_50);
    if (bVar4) {
      (this->currentBlock->globOptData).hasCSECandidates = true;
      pOVar2 = instr->m_src1;
      if (pOVar2 != (Opnd *)0x0) {
        bVar4 = IR::Opnd::IsRegOpnd(pOVar2);
        if (bVar4) {
          pRVar10 = IR::Opnd::AsRegOpnd(pOVar2);
          pSVar8 = pRVar10->m_sym;
          if ((pSVar8->field_0x1a & 1) != 0) {
            pSVar8 = StackSym::GetVarEquivSym(pSVar8,this->func);
          }
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((pBVar15->globOptData).liveFields,(pSVar8->super_Sym).m_id);
        }
        pOVar2 = instr->m_src2;
        if ((pOVar2 != (Opnd *)0x0) && (bVar4 = IR::Opnd::IsRegOpnd(pOVar2), bVar4)) {
          pRVar10 = IR::Opnd::AsRegOpnd(pOVar2);
          pSVar8 = pRVar10->m_sym;
          if ((pSVar8->field_0x1a & 1) != 0) {
            pSVar8 = StackSym::GetVarEquivSym(pSVar8,this->func);
          }
          BVSparse<Memory::JitArenaAllocator>::Set
                    ((pBVar15->globOptData).liveFields,(pSVar8->super_Sym).m_id);
        }
      }
    }
  }
  return;
}

Assistant:

void
GlobOpt::CSEAddInstr(
    BasicBlock *block,
    IR::Instr *instr,
    Value *dstVal,
    Value *src1Val,
    Value *src2Val,
    Value *dstIndirIndexVal,
    Value *src1IndirIndexVal)
{
    ExprAttributes exprAttributes;
    ExprHash hash;

    if (!this->DoCSE())
    {
        return;
    }

    bool isArray = false;

    switch(instr->m_opcode)
    {
    case Js::OpCode::LdElemI_A:
    case Js::OpCode::LdArrViewElem:
    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    {
        // For arrays, hash the value # of the baseOpnd and indexOpnd
        IR::IndirOpnd *arrayOpnd;
        Value *indirIndexVal;
        if (instr->m_opcode == Js::OpCode::StElemI_A || instr->m_opcode == Js::OpCode::StElemI_A_Strict)
        {
            if (!this->CanCSEArrayStore(instr))
            {
                return;
            }
            dstVal = src1Val;
            arrayOpnd = instr->GetDst()->AsIndirOpnd();
            indirIndexVal = dstIndirIndexVal;
        }
        else
        {
            // all the LdElem and Ld*ArrViewElem
            arrayOpnd = instr->GetSrc1()->AsIndirOpnd();
            indirIndexVal = src1IndirIndexVal;
        }

        src1Val = block->globOptData.FindValue(arrayOpnd->GetBaseOpnd()->m_sym);
        if(indirIndexVal)
        {
            src2Val = indirIndexVal;
        }
        else if (arrayOpnd->GetIndexOpnd())
        {
            src2Val = block->globOptData.FindValue(arrayOpnd->GetIndexOpnd()->m_sym);
        }
        else
        {
            return;
        }
        isArray = true;

        // for typed array do not add instructions whose dst are guaranteed to be int or number
        // as we will try to eliminate bound check for these typed arrays
        if (src1Val->GetValueInfo()->IsLikelyOptimizedVirtualTypedArray())
        {
            exprAttributes = DstIsIntOrNumberAttributes(!instr->dstIsAlwaysConvertedToInt32, !instr->dstIsAlwaysConvertedToNumber);
        }
        break;
    }

    case Js::OpCode::Mul_I4:
        // If int32 overflow is ignored, we only add MULs with 53-bit overflow check to expr map
        if (instr->HasBailOutInfo() && (instr->GetBailOutKind() & IR::BailOutOnMulOverflow) &&
            !instr->ShouldCheckFor32BitOverflow() && instr->ignoreOverflowBitCount != 53)
        {
            return;
        }

        // fall-through

    case Js::OpCode::Neg_I4:
    case Js::OpCode::Add_I4:
    case Js::OpCode::Sub_I4:
    case Js::OpCode::DivU_I4:
    case Js::OpCode::Div_I4:
    case Js::OpCode::RemU_I4:
    case Js::OpCode::Rem_I4:
    case Js::OpCode::ShrU_I4:
    {
        // Can't CSE and Add where overflow doesn't matter (and no bailout) with one where it does matter... Record whether int
        // overflow or negative zero were ignored.
        exprAttributes = IntMathExprAttributes(ignoredIntOverflowForCurrentInstr, ignoredNegativeZeroForCurrentInstr);
        break;
    }

    case Js::OpCode::InlineMathFloor:
    case Js::OpCode::InlineMathCeil:
    case Js::OpCode::InlineMathRound:
        if (!instr->ShouldCheckForNegativeZero())
        {
            return;
        }
        break;

    case Js::OpCode::Conv_Prim:
    case Js::OpCode::Conv_Prim_Sat:
        exprAttributes = ConvAttributes(instr->GetDst()->IsUnsigned(), instr->GetSrc1()->IsUnsigned());
        break;
    }

    ValueInfo *valueInfo = NULL;

    if (instr->GetDst())
    {
        if (!dstVal)
        {
            return;
        }

        valueInfo = dstVal->GetValueInfo();
        if(valueInfo->GetSymStore() == NULL &&
            !(isArray && valueInfo->HasIntConstantValue() && valueInfo->IsIntAndLikelyTagged() && instr->GetSrc1()->IsAddrOpnd()))
        {
            return;
        }
    }

    if (!this->GetHash(instr, src1Val, src2Val, exprAttributes, &hash))
    {
        return;
    }

    int32 intConstantValue;
    if(valueInfo && !valueInfo->GetSymStore() && valueInfo->TryGetIntConstantValue(&intConstantValue))
    {
        Assert(isArray);
        Assert(valueInfo->IsIntAndLikelyTagged());
        Assert(instr->GetSrc1()->IsAddrOpnd());

        // We need a sym associated with a value in the expression value table. Hoist the address into a stack sym associated
        // with the int constant value.
        StackSym *const constStackSym = GetOrCreateTaggedIntConstantStackSym(intConstantValue);
        instr->HoistSrc1(Js::OpCode::Ld_A, RegNOREG, constStackSym);
        currentBlock->globOptData.SetValue(dstVal, constStackSym);
    }

    // We have a candidate.  Add it to the exprToValueMap.
    Value ** pVal = block->globOptData.exprToValueMap->FindOrInsertNew(hash);
    *pVal = dstVal;

    if (isArray)
    {
        block->globOptData.liveArrayValues->Set(hash);
    }

    if (MayNeedBailOnImplicitCall(instr, src1Val, src2Val))
    {
        this->currentBlock->globOptData.hasCSECandidates = true;

        // Use LiveFields to track is object.valueOf/toString could get overridden.
        IR::Opnd *src1 = instr->GetSrc1();
        if (src1)
        {
            if (src1->IsRegOpnd())
            {
                StackSym *varSym = src1->AsRegOpnd()->m_sym;

                if (varSym->IsTypeSpec())
                {
                    varSym = varSym->GetVarEquivSym(this->func);
                }
                block->globOptData.liveFields->Set(varSym->m_id);
            }
            IR::Opnd *src2 = instr->GetSrc2();
            if (src2 && src2->IsRegOpnd())
            {
                StackSym *varSym = src2->AsRegOpnd()->m_sym;

                if (varSym->IsTypeSpec())
                {
                    varSym = varSym->GetVarEquivSym(this->func);
                }
                block->globOptData.liveFields->Set(varSym->m_id);
            }
        }
    }
}